

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

bool __thiscall wallet::SQLiteBatch::TxnBegin(SQLiteBatch *this)

{
  SQliteExecHandler *pSVar1;
  SQLiteDatabase *pSVar2;
  int iVar3;
  unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_> *puVar4;
  void *in_RSI;
  long in_FS_OFFSET;
  bool bVar5;
  string_view logging_function;
  string_view source_file;
  long *plVar6;
  char *in_stack_ffffffffffffffb0;
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_database->m_db == (sqlite3 *)0x0) || (this->m_txn != false)) {
    bVar5 = false;
  }
  else {
    CSemaphore::wait(&this->m_database->m_write_semaphore,in_RSI);
    if (this->m_database->m_db != (sqlite3 *)0x0) {
      sqlite3_get_autocommit();
    }
    inline_assertion_check<true,bool>
              ((bool *)&stack0xffffffffffffffa8,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
               ,0x28f,"TxnBegin","!m_database.HasActiveTxn()");
    puVar4 = inline_assertion_check<true,std::unique_ptr<wallet::SQliteExecHandler,std::default_delete<wallet::SQliteExecHandler>>&>
                       (&this->m_exec_handler,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                        ,0x290,"TxnBegin","m_exec_handler");
    pSVar1 = (puVar4->_M_t).
             super___uniq_ptr_impl<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::SQliteExecHandler_*,_std::default_delete<wallet::SQliteExecHandler>_>
             .super__Head_base<0UL,_wallet::SQliteExecHandler_*,_false>._M_head_impl;
    pSVar2 = this->m_database;
    plVar6 = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffa8,"BEGIN TRANSACTION","");
    iVar3 = (*pSVar1->_vptr_SQliteExecHandler[2])(pSVar1,pSVar2,&stack0xffffffffffffffa8);
    if (plVar6 != local_48) {
      operator_delete(plVar6,local_48[0] + 1);
    }
    bVar5 = iVar3 == 0;
    if (bVar5) {
      this->m_txn = true;
    }
    else {
      logging_function._M_str = "TxnBegin";
      logging_function._M_len = 8;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file._M_len = 0x5a;
      ::LogPrintf_<>(logging_function,source_file,0x292,
                     IPC|COINDB|LIBEVENT|MEMPOOLREJ|RAND|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|
                     WALLETDB|HTTP|MEMPOOL|NET,(Level)plVar6,in_stack_ffffffffffffffb0);
      CSemaphore::post(&this->m_database->m_write_semaphore);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool SQLiteBatch::TxnBegin()
{
    if (!m_database.m_db || m_txn) return false;
    m_database.m_write_semaphore.wait();
    Assert(!m_database.HasActiveTxn());
    int res = Assert(m_exec_handler)->Exec(m_database, "BEGIN TRANSACTION");
    if (res != SQLITE_OK) {
        LogPrintf("SQLiteBatch: Failed to begin the transaction\n");
        m_database.m_write_semaphore.post();
    } else {
        m_txn = true;
    }
    return res == SQLITE_OK;
}